

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O3

void p2sc_strip_strings(char ***sss)

{
  char **ppcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 in_EAX;
  uint uVar4;
  undefined4 in_register_00000004;
  ulong uVar5;
  char *s;
  char *local_38;
  
  local_38 = (char *)CONCAT44(in_register_00000004,in_EAX);
  ppcVar1 = *sss;
  uVar4 = g_strv_length(ppcVar1);
  uVar2 = g_array_sized_new(1,0,8,uVar4);
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      uVar3 = g_strchug(ppcVar1[uVar5]);
      local_38 = (char *)g_strchomp(uVar3);
      if (*local_38 == '\0') {
        g_free(local_38);
      }
      else {
        g_array_append_vals(uVar2,&local_38,1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  g_free(ppcVar1);
  ppcVar1 = (char **)g_array_free(uVar2,0);
  *sss = ppcVar1;
  return;
}

Assistant:

void p2sc_strip_strings(char ***sss) {
    char **ss = *sss, *s;
    guint i, n = g_strv_length(ss);
    GArray *a = g_array_sized_new(TRUE, FALSE, sizeof(char *), n);

    for (i = 0; i < n; ++i) {
        s = g_strstrip(ss[i]);
        if (!*s)
            g_free(s);
        else
            g_array_append_val(a, s);
    }
    g_free(ss);
    *sss = (char **) g_array_free(a, FALSE);
}